

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

GetShapeLayerParams * __thiscall
CoreML::Specification::GetShapeLayerParams::New(GetShapeLayerParams *this,Arena *arena)

{
  GetShapeLayerParams *this_00;
  
  this_00 = (GetShapeLayerParams *)operator_new(0x18);
  GetShapeLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GetShapeLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GetShapeLayerParams* GetShapeLayerParams::New(::google::protobuf::Arena* arena) const {
  GetShapeLayerParams* n = new GetShapeLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}